

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_allocator.cpp
# Opt level: O0

void __thiscall duckdb::ArenaAllocator::AllocateNewBlock(ArenaAllocator *this,idx_t min_size)

{
  bool bVar1;
  pointer pAVar2;
  pointer pAVar3;
  ulong in_RSI;
  long in_RDI;
  templated_unique_single_t new_chunk;
  idx_t capacity;
  unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>,_false>
  *in_stack_ffffffffffffffa8;
  pointer in_stack_ffffffffffffffb0;
  unsigned_long *in_stack_ffffffffffffffd0;
  Allocator *in_stack_ffffffffffffffd8;
  ulong local_18;
  
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_> *)
                     0xc31661);
  if (bVar1) {
    pAVar3 = unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>,_false>::
             operator->((unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>,_false>
                         *)in_stack_ffffffffffffffb0);
    local_18 = pAVar3->maximum_size;
  }
  else {
    local_18 = *(ulong *)(in_RDI + 8);
  }
  if (0x1000000 < local_18) {
    local_18 = 0x1000000;
  }
  if (local_18 < 0x1000000) {
    local_18 = local_18 << 1;
  }
  for (; local_18 < in_RSI; local_18 = local_18 << 1) {
  }
  make_unsafe_uniq<duckdb::ArenaChunk,duckdb::Allocator&,unsigned_long&>
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_> *)
                     0xc316fa);
  if (bVar1) {
    pAVar3 = ::std::unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>::get
                       ((unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_> *)
                        in_stack_ffffffffffffffb0);
    pAVar2 = unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>,_false>::
             operator->((unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>,_false>
                         *)in_stack_ffffffffffffffb0);
    pAVar2->prev = pAVar3;
    in_stack_ffffffffffffffa8 =
         (unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>,_false> *)
         (in_RDI + 0x10);
    in_stack_ffffffffffffffb0 =
         unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>,_false>::operator->
                   ((unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>,_false>
                     *)in_stack_ffffffffffffffb0);
    unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>,_false>::operator=
              ((unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>,_false> *)
               in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  else {
    pAVar3 = ::std::unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>::get
                       ((unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_> *)
                        in_stack_ffffffffffffffb0);
    *(pointer *)(in_RDI + 0x18) = pAVar3;
  }
  unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>,_false>::operator=
            ((unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>,_false> *)
             in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  *(ulong *)(in_RDI + 0x40) = local_18 + *(long *)(in_RDI + 0x40);
  unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>,_false>::~unique_ptr
            ((unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>,_false> *)
             0xc317c3);
  return;
}

Assistant:

void ArenaAllocator::AllocateNewBlock(idx_t min_size) {
	idx_t capacity;
	// start off with either (1) initial capacity (if we have no block) or (2) capacity of the previous block
	if (!head) {
		capacity = initial_capacity;
	} else {
		capacity = head->maximum_size;
	}
	// capacity of the previous block can be bigger than the max capacity if we allocate len > max capacity
	// for new blocks - try to set it back to the max capacity
	if (capacity > ARENA_ALLOCATOR_MAX_CAPACITY) {
		capacity = ARENA_ALLOCATOR_MAX_CAPACITY;
	}
	// if we are below the max capacity - double the size of the block
	if (capacity < ARENA_ALLOCATOR_MAX_CAPACITY) {
		capacity *= 2;
	}
	// we double the size until we can fit `len`
	// this is generally only relevant if len is very large
	while (capacity < min_size) {
		capacity *= 2;
	}
	auto new_chunk = make_unsafe_uniq<ArenaChunk>(allocator, capacity);
	if (head) {
		head->prev = new_chunk.get();
		new_chunk->next = std::move(head);
	} else {
		tail = new_chunk.get();
	}
	head = std::move(new_chunk);
	allocated_size += capacity;
}